

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::
     VerifyBlockConsistencyInList
               (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *heapBlock,
               RecyclerVerifyListConsistencyData *recyclerSweep,SweepState state)

{
  bool bVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  bool expectDispose;
  bool expectFull;
  SweepState state_local;
  RecyclerVerifyListConsistencyData *recyclerSweep_local;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_local;
  
  bVar4 = (recyclerSweep->mediumBlockVerifyListConsistencyData).expectFull;
  bVar1 = (recyclerSweep->mediumBlockVerifyListConsistencyData).expectDispose;
  bVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsClearedFromAllocator
                    (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
  if (bVar3) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::SetIsClearedFromAllocator
              (&heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>,false);
    if (state == SweepStateFull) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x3f4,"(SweepStateFull != state)","SweepStateFull != state");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else if (((bVar4 & 1U) == 0) && (state == SweepStateFull)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x3f9,"(expectFull || SweepStateFull != state)",
                       "expectFull || SweepStateFull != state");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((bVar1 & 1U) != 0) && (state != SweepStatePendingDispose)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x3fd,"(!expectDispose || SweepStatePendingDispose == state)",
                       "!expectDispose || SweepStatePendingDispose == state");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::VerifyBlockConsistencyInList(TBlockType * heapBlock, RecyclerVerifyListConsistencyData const& recyclerSweep, SweepState state)
{
    bool expectFull = false;
    bool expectDispose = false;

    if (TBlockType::HeapBlockAttributes::IsSmallBlock)
    {
        expectFull = recyclerSweep.smallBlockVerifyListConsistencyData.expectFull;
        expectDispose = recyclerSweep.smallBlockVerifyListConsistencyData.expectDispose;
    }
    else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
    {
        expectFull = recyclerSweep.mediumBlockVerifyListConsistencyData.expectFull;
        expectDispose = recyclerSweep.mediumBlockVerifyListConsistencyData.expectDispose;
    }
    else
    {
        Assert(false);
    }

    if (heapBlock->IsClearedFromAllocator())
    {
        // this function is called during sweep and we are recreating the heap block list
        // which would make all the block to be in it's rightful place
        heapBlock->SetIsClearedFromAllocator(false);

        Assert(SweepStateFull != state);
    }
    else
    {
        // You can still be full only if you are full before.
        Assert(expectFull || SweepStateFull != state);
    }

    // If you were pending dispose before, you can only be pending dispose after
    Assert(!expectDispose || SweepStatePendingDispose == state);
}